

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O2

bool __thiscall S2Cap::Contains(S2Cap *this,S2Point *p)

{
  bool bVar1;
  S1ChordAngle local_30;
  S2LogMessage local_28;
  
  bVar1 = S2::IsUnitLength(p);
  if (bVar1) {
    S1ChordAngle::S1ChordAngle(&local_30,&this->center_,p);
    return local_30.length2_ <= (this->radius_).length2_;
  }
  S2LogMessage::S2LogMessage
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
             ,0x123,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_28.stream_,"Check failed: S2::IsUnitLength(p) ");
  abort();
}

Assistant:

bool S2Cap::Contains(const S2Point& p) const {
  S2_DCHECK(S2::IsUnitLength(p));
  return S1ChordAngle(center_, p) <= radius_;
}